

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
AnalyzeShortFunctionDefinition
          (ExpressionContext *ctx,SynShortFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *argumentType)

{
  SynIdentifier *source;
  ArrayView<ArgumentData> argData_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  TypeBase *argType;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  undefined4 extraout_var_00;
  size_t sVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TypeFunction *instanceType;
  ExprBase *pEVar6;
  VariableData *context;
  ExprVariableDefinition *pEVar7;
  MatchData *in_R9;
  SynShortFunctionArgument *pSVar8;
  TypeHandle *pTVar9;
  ArrayView<ArgumentData> arguments;
  InplaceStr name;
  InplaceStr name_00;
  IntrusiveList<MatchData> argCasts_00;
  char *local_6c8;
  ArgumentData local_6c0;
  FunctionData *local_690;
  TypeBase *local_688;
  SynIdentifier *local_680;
  IntrusiveList<MatchData> argCasts;
  undefined4 uStack_65c;
  IntrusiveList<MatchData> aliases;
  SmallArray<ArgumentData,_32U> argData;
  char *dst;
  
  uVar1 = IntrusiveList<SynShortFunctionArgument>::size(&syntax->arguments);
  uVar2 = IntrusiveList<TypeHandle>::size(&argumentType->arguments);
  if (uVar1 == uVar2) {
    local_688 = argumentType->returnType;
    if (local_688->isGeneric != false) {
      local_688 = ctx->typeAuto;
    }
    argCasts.head = (MatchData *)0x0;
    argCasts.tail = (MatchData *)0x0;
    local_690 = genericProto;
    SmallArray<ArgumentData,_32U>::SmallArray(&argData,ctx->allocator);
    pTVar9 = (argumentType->arguments).head;
    pSVar8 = (syntax->arguments).head;
    local_6c8 = "ERROR: function argument cannot be an auto type";
    while (pSVar8 != (SynShortFunctionArgument *)0x0) {
      if (pSVar8->type == (SynBase *)0x0) {
LAB_00157af0:
        local_6c0.name = pSVar8->name;
        local_6c0.type = pTVar9->type;
        local_6c0.isExplicit = false;
        local_6c0.value = (ExprBase *)0x0;
        local_6c0.valueFunction = (FunctionData *)0x0;
        local_6c0.source = &pSVar8->super_SynBase;
        SmallArray<ArgumentData,_32U>::push_back(&argData,&local_6c0);
      }
      else {
        argType = AnalyzeType(ctx,pSVar8->type,true,(bool *)0x0);
        if (argType == (TypeBase *)0x0) goto LAB_00157af0;
        if (argType == ctx->typeAuto) {
LAB_00157ccb:
          anon_unknown.dwarf_94284::Stop(ctx,&syntax->super_SynBase,local_6c8);
        }
        if (argType == ctx->typeVoid) {
          local_6c8 = "ERROR: function argument cannot be a void type";
          goto LAB_00157ccb;
        }
        if (argType->typeID == 0) goto LAB_00157c9a;
        uVar1 = (*(int *)&(pSVar8->name->name).end - *(int *)&(pSVar8->name->name).begin) + 2;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar1);
        dst = (char *)CONCAT44(extraout_var,iVar3);
        NULLC::SafeSprintf(dst,(ulong)uVar1,"%.*s$",
                           (ulong)(uint)(*(int *)&(pSVar8->name->name).end -
                                        (int)(pSVar8->name->name).begin));
        if (pTVar9->type->isGeneric == true) {
          aliases.head = (MatchData *)0x0;
          aliases.tail = (MatchData *)0x0;
          in_R9 = (MatchData *)0x0;
          pTVar4 = MatchGenericType(ctx,&syntax->super_SynBase,pTVar9->type,argType,&aliases,false);
          if (pTVar4 == (TypeBase *)0x0) goto LAB_00157c9a;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          local_680 = pSVar8->name;
          sVar5 = strlen(dst);
          name.end = dst + sVar5;
          name.begin = dst;
          SynIdentifier::SynIdentifier
                    ((SynIdentifier *)CONCAT44(extraout_var_00,iVar3),local_680,name);
          local_6c0.isExplicit = false;
          local_6c0.value = (ExprBase *)0x0;
          local_6c0.valueFunction = (FunctionData *)0x0;
          local_6c0.source = &pSVar8->super_SynBase;
          local_6c0.name = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
          local_6c0.type = pTVar4;
          SmallArray<ArgumentData,_32U>::push_back(&argData,&local_6c0);
        }
        else {
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          source = pSVar8->name;
          sVar5 = strlen(dst);
          name_00.end = dst + sVar5;
          name_00.begin = dst;
          SynIdentifier::SynIdentifier
                    ((SynIdentifier *)CONCAT44(extraout_var_01,iVar3),source,name_00);
          local_6c0.type = pTVar9->type;
          local_6c0.isExplicit = false;
          local_6c0.value = (ExprBase *)0x0;
          local_6c0.valueFunction = (FunctionData *)0x0;
          local_6c0.source = &pSVar8->super_SynBase;
          local_6c0.name = (SynIdentifier *)CONCAT44(extraout_var_01,iVar3);
          SmallArray<ArgumentData,_32U>::push_back(&argData,&local_6c0);
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        MatchData::MatchData((MatchData *)CONCAT44(extraout_var_02,iVar3),pSVar8->name,argType);
        IntrusiveList<MatchData>::push_back(&argCasts,(MatchData *)CONCAT44(extraout_var_02,iVar3));
      }
      pTVar9 = pTVar9->next;
      pSVar8 = (SynShortFunctionArgument *)(pSVar8->super_SynBase).next;
      if ((pSVar8 == (SynShortFunctionArgument *)0x0) || ((pSVar8->super_SynBase).typeID != 0x38)) {
        pSVar8 = (SynShortFunctionArgument *)0x0;
      }
    }
    arguments.count = argData.count;
    arguments.data = argData.data;
    arguments._12_4_ = 0;
    instanceType = ExpressionContext::GetFunctionType
                             (ctx,&syntax->super_SynBase,local_688,arguments);
    argData_00._12_4_ = uStack_65c;
    argData_00.count = argData.count;
    argData_00.data = argData.data;
    argCasts_00.tail = in_R9;
    argCasts_00.head = argCasts.head;
    pEVar6 = AnalyzeShortFunctionDefinition
                       (ctx,syntax,local_690,instanceType,argCasts_00,argData_00);
    if (pEVar6 == (ExprBase *)0x0) {
LAB_00157c9a:
      pEVar6 = (ExprBase *)0x0;
    }
    else if (pEVar6->typeID == 0x24) {
      context = CreateFunctionContextVariable
                          (ctx,&syntax->super_SynBase,(FunctionData *)pEVar6[1]._vptr_ExprBase,
                           (FunctionData *)0x0);
      pEVar6[2].source = (SynBase *)context;
      pEVar7 = CreateFunctionContextVariableDefinition
                         (ctx,&syntax->super_SynBase,(FunctionData *)pEVar6[1]._vptr_ExprBase,
                          (FunctionData *)0x0,context);
      *(ExprVariableDefinition **)&pEVar6[2].typeID = pEVar7;
    }
    SmallArray<ArgumentData,_32U>::~SmallArray(&argData);
  }
  else {
    pEVar6 = (ExprBase *)0x0;
  }
  return pEVar6;
}

Assistant:

ExprBase* AnalyzeShortFunctionDefinition(ExpressionContext &ctx, SynShortFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *argumentType)
{
	if(syntax->arguments.size() != argumentType->arguments.size())
		return NULL;

	TypeBase *returnType = argumentType->returnType;

	if(returnType->isGeneric)
		returnType = ctx.typeAuto;

	IntrusiveList<MatchData> argCasts;
	SmallArray<ArgumentData, 32> argData(ctx.allocator);

	TypeHandle *expected = argumentType->arguments.head;

	for(SynShortFunctionArgument *param = syntax->arguments.head; param; param = getType<SynShortFunctionArgument>(param->next))
	{
		TypeBase *type = NULL;

		if(param->type)
			type = AnalyzeType(ctx, param->type);

		if(type)
		{
			if(type == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(type == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			if(isType<TypeError>(type))
				return NULL;

			unsigned length = param->name->name.length() + 2;
			char *name = (char*)ctx.allocator->alloc(length);

			NULLC::SafeSprintf(name, length, "%.*s$", FMT_ISTR(param->name->name));

			if(expected->type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				if(TypeBase *match = MatchGenericType(ctx, syntax, expected->type, type, aliases, false))
					argData.push_back(ArgumentData(param, false, new (ctx.get<SynIdentifier>()) SynIdentifier(param->name, InplaceStr(name)), match, NULL));
				else
					return NULL;
			}
			else
			{
				argData.push_back(ArgumentData(param, false, new (ctx.get<SynIdentifier>()) SynIdentifier(param->name, InplaceStr(name)), expected->type, NULL));
			}

			argCasts.push_back(new (ctx.get<MatchData>()) MatchData(param->name, type));
		}
		else
		{
			argData.push_back(ArgumentData(param, false, param->name, expected->type, NULL));
		}

		expected = expected->next;
	}

	TypeFunction *instanceType = ctx.GetFunctionType(syntax, returnType, argData);

	ExprBase *definition = AnalyzeShortFunctionDefinition(ctx, syntax, genericProto, instanceType, argCasts, argData);

	if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(definition))
	{
		node->contextVariable = CreateFunctionContextVariable(ctx, syntax, node->function, NULL);
		node->contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, syntax, node->function, NULL, node->contextVariable);
	}

	return definition;
}